

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.hpp
# Opt level: O2

bool __thiscall units::fixed_measurement::operator==(fixed_measurement *this,measurement *val)

{
  bool bVar1;
  double val_00;
  unit local_20;
  
  local_20 = val->units_;
  bVar1 = unit::operator==(&this->units_,&local_20);
  if (bVar1) {
    val_00 = val->value_;
  }
  else {
    val_00 = measurement::value_as(val,&this->units_);
  }
  bVar1 = operator==(this,val_00);
  return bVar1;
}

Assistant:

bool operator==(const measurement& val) const
    {
        return operator==(
            (units_ == val.units()) ? val.value() : val.value_as(units_));
    }